

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteCodeGenerator.cpp
# Opt level: O1

void Visit<void(*)(ParseNode*,ByteCodeGenerator*),void(*)(ParseNode*,ByteCodeGenerator*)>
               (ParseNode *pnode,ByteCodeGenerator *byteCodeGenerator,
               _func_void_ParseNode_ptr_ByteCodeGenerator_ptr *prefix,
               _func_void_ParseNode_ptr_ByteCodeGenerator_ptr *postfix,ParseNode *pnodeParent)

{
  OpCode OVar1;
  code *pcVar2;
  bool bVar3;
  uint uVar4;
  ParseNodeVar *pPVar5;
  ParseNodeForInOrForOf *pPVar6;
  ParseNodeFnc *pPVar7;
  ParseNodeWhile *pPVar8;
  ParseNodeBin *pPVar9;
  ParseNodeStrTemplate *pPVar10;
  ParseNodeTryFinally *pPVar11;
  ParseNodeTryCatch *pPVar12;
  ParseNodeIf *pPVar13;
  ParseNodeParamPattern *pPVar14;
  ParseNodeCase *pPVar15;
  ParseNodeBlock *pPVar16;
  ParseNode *pPVar17;
  ParseNodeWith *pPVar18;
  ParseNodeTri *pPVar19;
  undefined4 *puVar20;
  ParseNodeProg *pPVar21;
  ParseNodeTry *pPVar22;
  ParseNodeCall *pPVar23;
  SListBase<ParseNode_*,_Memory::ArenaAllocator,_RealCount> *pSVar24;
  Type *ppPVar25;
  ParseNodeSuperCall *pPVar26;
  ParseNodeFor *pPVar27;
  ParseNodeClass *pPVar28;
  ParseNodeSwitch *pPVar29;
  ParseNodeCatch *pPVar30;
  ParseNodeReturn *pPVar31;
  ParseNodeUni *pPVar32;
  _func_void_ParseNode_ptr_ByteCodeGenerator_ptr *p_Var33;
  SListNodeBase<Memory::ArenaAllocator> local_58;
  uint i;
  ArenaAllocator *local_48;
  _func_void_ParseNode_ptr_ByteCodeGenerator_ptr *local_40;
  _func_void_ParseNode_ptr_ByteCodeGenerator_ptr *local_38;
  
  if (pnode == (ParseNode *)0x0) {
    return;
  }
  ThreadContext::ProbeCurrentStackNoDispose(0x2400,byteCodeGenerator->scriptContext);
  local_38 = prefix;
  (*prefix)(pnode,byteCodeGenerator);
  OVar1 = pnode->nop;
  pPVar17 = pnode;
  switch(OVar1) {
  case knopCall:
    pPVar23 = ParseNode::AsParseNodeCall(pnode);
    p_Var33 = local_38;
    Visit<void(*)(ParseNode*,ByteCodeGenerator*),void(*)(ParseNode*,ByteCodeGenerator*)>
              (pPVar23->pnodeTarget,byteCodeGenerator,local_38,postfix,(ParseNode *)0x0);
    pPVar23 = ParseNode::AsParseNodeCall(pnode);
    Visit<void(*)(ParseNode*,ByteCodeGenerator*),void(*)(ParseNode*,ByteCodeGenerator*)>
              (pPVar23->pnodeArgs,byteCodeGenerator,p_Var33,postfix,(ParseNode *)0x0);
    pPVar23 = ParseNode::AsParseNodeCall(pnode);
    if ((pPVar23->field_0x24 & 8) == 0) goto switchD_0083a0ea_caseD_55;
    pPVar26 = ParseNode::AsParseNodeSuperCall(pnode);
    p_Var33 = local_38;
    Visit<void(*)(ParseNode*,ByteCodeGenerator*),void(*)(ParseNode*,ByteCodeGenerator*)>
              ((ParseNode *)pPVar26->pnodeThis,byteCodeGenerator,local_38,postfix,(ParseNode *)0x0);
    pPVar26 = ParseNode::AsParseNodeSuperCall(pnode);
    pPVar16 = (ParseNodeBlock *)pPVar26->pnodeNewTarget;
    break;
  case knopDot:
  case knopAsg:
  case knopInstOf:
  case knopIn:
  case knopEqv:
  case knopNEqv:
  case knopLogOr:
  case knopLogAnd:
  case knopCoalesce:
  case knopLsh:
  case knopRsh:
  case knopRs2:
  case knopIndex:
  case knopAsgAdd:
  case knopAsgSub:
  case knopAsgMul:
  case knopAsgDiv:
  case knopAsgExpo:
  case knopAsgMod:
  case knopAsgAnd:
  case knopAsgXor:
  case knopAsgOr:
  case knopAsgLsh:
  case knopAsgRsh:
  case knopAsgRs2:
  case knopMember:
  case knopMemberShort:
  case knopSetMember:
  case knopGetMember:
  case knopTemp:
  case knopModule:
  case knopEndCode:
  case knopDebugger:
  case knopObjectPattern:
  case knopObjectPatternMember:
switchD_0083a0ea_caseD_30:
    uVar4 = ParseNode::Grfnop((uint)OVar1);
    if ((uVar4 & 4) != 0) goto switchD_0083a0ea_caseD_6d;
    if ((uVar4 & 8) == 0) goto switchD_0083a0ea_caseD_55;
    pPVar9 = ParseNode::AsParseNodeBin(pnode);
    p_Var33 = local_38;
    Visit<void(*)(ParseNode*,ByteCodeGenerator*),void(*)(ParseNode*,ByteCodeGenerator*)>
              (pPVar9->pnode1,byteCodeGenerator,local_38,postfix,(ParseNode *)0x0);
    pPVar9 = ParseNode::AsParseNodeBin(pnode);
    Visit<void(*)(ParseNode*,ByteCodeGenerator*),void(*)(ParseNode*,ByteCodeGenerator*)>
              (pPVar9->pnode2,byteCodeGenerator,p_Var33,postfix,(ParseNode *)0x0);
    pPVar9 = ParseNode::AsParseNodeBin(pnode);
    bVar3 = ByteCodeGenerator::IsSuper(pPVar9->pnode1);
    if (!bVar3) goto switchD_0083a0ea_caseD_55;
    pPVar10 = (ParseNodeStrTemplate *)ParseNode::AsParseNodeSuperReference(pnode);
    goto LAB_0083aa13;
  case knopComma:
    local_40 = postfix;
    pPVar9 = ParseNode::AsParseNodeBin(pnode);
    p_Var33 = local_38;
    postfix = local_40;
    pPVar17 = pPVar9->pnode1;
    if (pPVar17->nop == knopComma) {
      local_48 = byteCodeGenerator->alloc;
      i = 0;
      local_58.next = (Type)&stack0xffffffffffffffa8;
      do {
        pPVar9 = ParseNode::AsParseNodeBin(pPVar17);
        pSVar24 = (SListBase<ParseNode_*,_Memory::ArenaAllocator,_RealCount> *)
                  new<Memory::ArenaAllocator>(0x10,local_48,0x366bee);
        *(ParseNodePtr *)&pSVar24->super_RealCount = pPVar9->pnode2;
        (pSVar24->super_SListNodeBase<Memory::ArenaAllocator>).next = local_58.next;
        i = i + 1;
        local_58.next = (Type)pSVar24;
        pPVar9 = ParseNode::AsParseNodeBin(pPVar17);
        pPVar17 = pPVar9->pnode1;
      } while (pPVar17->nop == knopComma);
      Visit<void(*)(ParseNode*,ByteCodeGenerator*),void(*)(ParseNode*,ByteCodeGenerator*)>
                (pPVar17,byteCodeGenerator,local_38,local_40,(ParseNode *)0x0);
      while ((SListBase<ParseNode_*,_Memory::ArenaAllocator,_RealCount> *)local_58.next !=
             (SListBase<ParseNode_*,_Memory::ArenaAllocator,_RealCount> *)&stack0xffffffffffffffa8)
      {
        ppPVar25 = SListBase<ParseNode_*,_Memory::ArenaAllocator,_RealCount>::Head
                             ((SListBase<ParseNode_*,_Memory::ArenaAllocator,_RealCount> *)
                              &stack0xffffffffffffffa8);
        pPVar17 = *ppPVar25;
        SListBase<ParseNode_*,_Memory::ArenaAllocator,_RealCount>::RemoveHead
                  ((SListBase<ParseNode_*,_Memory::ArenaAllocator,_RealCount> *)
                   &stack0xffffffffffffffa8,local_48);
        Visit<void(*)(ParseNode*,ByteCodeGenerator*),void(*)(ParseNode*,ByteCodeGenerator*)>
                  (pPVar17,byteCodeGenerator,local_38,local_40,(ParseNode *)0x0);
      }
      SList<ParseNode_*,_Memory::ArenaAllocator,_RealCount>::~SList
                ((SList<ParseNode_*,_Memory::ArenaAllocator,_RealCount> *)&stack0xffffffffffffffa8);
      postfix = local_40;
      p_Var33 = local_38;
    }
    else {
      Visit<void(*)(ParseNode*,ByteCodeGenerator*),void(*)(ParseNode*,ByteCodeGenerator*)>
                (pPVar17,byteCodeGenerator,local_38,local_40,(ParseNode *)0x0);
    }
    pPVar9 = ParseNode::AsParseNodeBin(pnode);
    pPVar16 = (ParseNodeBlock *)pPVar9->pnode2;
    break;
  case knopNew:
    pPVar23 = ParseNode::AsParseNodeCall(pnode);
    Visit<void(*)(ParseNode*,ByteCodeGenerator*),void(*)(ParseNode*,ByteCodeGenerator*)>
              (pPVar23->pnodeTarget,byteCodeGenerator,local_38,postfix,(ParseNode *)0x0);
    bVar3 = IsCallOfConstants(pnode);
    if (bVar3) goto switchD_0083a0ea_caseD_55;
    pPVar23 = ParseNode::AsParseNodeCall(pnode);
    pPVar16 = (ParseNodeBlock *)pPVar23->pnodeArgs;
    p_Var33 = local_38;
    break;
  case knopQmark:
    pPVar19 = ParseNode::AsParseNodeTri(pnode);
    p_Var33 = local_38;
    Visit<void(*)(ParseNode*,ByteCodeGenerator*),void(*)(ParseNode*,ByteCodeGenerator*)>
              (pPVar19->pnode1,byteCodeGenerator,local_38,postfix,(ParseNode *)0x0);
    pPVar19 = ParseNode::AsParseNodeTri(pnode);
    Visit<void(*)(ParseNode*,ByteCodeGenerator*),void(*)(ParseNode*,ByteCodeGenerator*)>
              (pPVar19->pnode2,byteCodeGenerator,p_Var33,postfix,(ParseNode *)0x0);
    pPVar19 = ParseNode::AsParseNodeTri(pnode);
    pPVar16 = (ParseNodeBlock *)pPVar19->pnode3;
    break;
  case knopList:
    VisitList<void(*)(ParseNode*,ByteCodeGenerator*),void(*)(ParseNode*,ByteCodeGenerator*)>
              (pnode,byteCodeGenerator,local_38,postfix);
    goto switchD_0083a0ea_caseD_55;
  case knopVarDecl:
  case knopConstDecl:
  case knopLetDecl:
    pPVar5 = ParseNode::AsParseNodeVar(pnode);
    if (pPVar5->pnodeInit == (ParseNodePtr)0x0) goto switchD_0083a0ea_caseD_55;
    pPVar5 = ParseNode::AsParseNodeVar(pnode);
    pPVar16 = (ParseNodeBlock *)pPVar5->pnodeInit;
    p_Var33 = local_38;
    break;
  case knopFncDecl:
  case knopBreak:
  case knopContinue:
    goto switchD_0083a0ea_caseD_55;
  case knopClassDecl:
    pPVar28 = ParseNode::AsParseNodeClass(pnode);
    p_Var33 = local_38;
    Visit<void(*)(ParseNode*,ByteCodeGenerator*),void(*)(ParseNode*,ByteCodeGenerator*)>
              (&pPVar28->pnodeDeclName->super_ParseNode,byteCodeGenerator,local_38,postfix,
               (ParseNode *)0x0);
    pPVar28 = ParseNode::AsParseNodeClass(pnode);
    BeginVisitBlock(pPVar28->pnodeBlock,byteCodeGenerator);
    pPVar28 = ParseNode::AsParseNodeClass(pnode);
    Visit<void(*)(ParseNode*,ByteCodeGenerator*),void(*)(ParseNode*,ByteCodeGenerator*)>
              (pPVar28->pnodeExtends,byteCodeGenerator,p_Var33,postfix,(ParseNode *)0x0);
    pPVar28 = ParseNode::AsParseNodeClass(pnode);
    Visit<void(*)(ParseNode*,ByteCodeGenerator*),void(*)(ParseNode*,ByteCodeGenerator*)>
              (&pPVar28->pnodeName->super_ParseNode,byteCodeGenerator,p_Var33,postfix,
               (ParseNode *)0x0);
    pPVar28 = ParseNode::AsParseNodeClass(pnode);
    Visit<void(*)(ParseNode*,ByteCodeGenerator*),void(*)(ParseNode*,ByteCodeGenerator*)>
              (&pPVar28->pnodeConstructor->super_ParseNode,byteCodeGenerator,p_Var33,postfix,
               (ParseNode *)0x0);
    pPVar28 = ParseNode::AsParseNodeClass(pnode);
    Visit<void(*)(ParseNode*,ByteCodeGenerator*),void(*)(ParseNode*,ByteCodeGenerator*)>
              (pPVar28->pnodeMembers,byteCodeGenerator,p_Var33,postfix,(ParseNode *)0x0);
    pPVar28 = ParseNode::AsParseNodeClass(pnode);
    pPVar16 = pPVar28->pnodeBlock;
    goto LAB_0083a8f9;
  case knopProg:
    local_40 = postfix;
    pPVar7 = ParseNode::AsParseNodeFnc(pnode);
    if (pPVar7->pnodeBody == (ParseNodePtr)0x0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar20 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar20 = 1;
      bVar3 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeGenerator.cpp"
                         ,0x152,"(pnode->AsParseNodeFnc()->pnodeBody)",
                         "pnode->AsParseNodeFnc()->pnodeBody");
      if (!bVar3) {
        pcVar2 = (code *)invalidInstructionException();
        (*pcVar2)();
      }
      *puVar20 = 0;
    }
    local_58.next = (Type)((ulong)local_58.next._4_4_ << 0x20);
    pPVar7 = ParseNode::AsParseNodeFnc(pnode);
    p_Var33 = local_38;
    postfix = local_40;
    VisitNestedScopes<void(*)(ParseNode*,ByteCodeGenerator*),void(*)(ParseNode*,ByteCodeGenerator*)>
              ((ParseNode *)pPVar7->pnodeScopes,pnode,byteCodeGenerator,local_38,local_40,
               (uint *)&stack0xffffffffffffffa8,false);
    pPVar7 = ParseNode::AsParseNodeFnc(pnode);
    BeginVisitBlock(pPVar7->pnodeScopes,byteCodeGenerator);
    pPVar7 = ParseNode::AsParseNodeFnc(pnode);
    pPVar17 = VisitBlock<void(*)(ParseNode*,ByteCodeGenerator*),void(*)(ParseNode*,ByteCodeGenerator*)>
                        (pPVar7->pnodeBody,byteCodeGenerator,p_Var33,postfix,(ParseNode *)0x0);
    pPVar21 = ParseNode::AsParseNodeProg(pnode);
    pPVar21->pnodeLastValStmt = pPVar17;
    pPVar7 = ParseNode::AsParseNodeFnc(pnode);
    goto LAB_0083a5bd;
  case knopFor:
    pPVar27 = ParseNode::AsParseNodeFor(pnode);
    BeginVisitBlock(pPVar27->pnodeBlock,byteCodeGenerator);
    pPVar27 = ParseNode::AsParseNodeFor(pnode);
    p_Var33 = local_38;
    Visit<void(*)(ParseNode*,ByteCodeGenerator*),void(*)(ParseNode*,ByteCodeGenerator*)>
              (pPVar27->pnodeInit,byteCodeGenerator,local_38,postfix,(ParseNode *)0x0);
    ByteCodeGenerator::EnterLoop(byteCodeGenerator);
    pPVar27 = ParseNode::AsParseNodeFor(pnode);
    Visit<void(*)(ParseNode*,ByteCodeGenerator*),void(*)(ParseNode*,ByteCodeGenerator*)>
              (pPVar27->pnodeCond,byteCodeGenerator,p_Var33,postfix,(ParseNode *)0x0);
    pPVar27 = ParseNode::AsParseNodeFor(pnode);
    Visit<void(*)(ParseNode*,ByteCodeGenerator*),void(*)(ParseNode*,ByteCodeGenerator*)>
              (pPVar27->pnodeIncr,byteCodeGenerator,p_Var33,postfix,(ParseNode *)0x0);
    pPVar27 = ParseNode::AsParseNodeFor(pnode);
    Visit<void(*)(ParseNode*,ByteCodeGenerator*),void(*)(ParseNode*,ByteCodeGenerator*)>
              (pPVar27->pnodeBody,byteCodeGenerator,p_Var33,postfix,pnode);
    byteCodeGenerator->loopDepth = byteCodeGenerator->loopDepth - 1;
    pPVar27 = ParseNode::AsParseNodeFor(pnode);
    pPVar16 = pPVar27->pnodeBlock;
    goto LAB_0083a8f9;
  case knopIf:
    pPVar13 = ParseNode::AsParseNodeIf(pnode);
    p_Var33 = local_38;
    Visit<void(*)(ParseNode*,ByteCodeGenerator*),void(*)(ParseNode*,ByteCodeGenerator*)>
              (pPVar13->pnodeCond,byteCodeGenerator,local_38,postfix,(ParseNode *)0x0);
    pPVar13 = ParseNode::AsParseNodeIf(pnode);
    Visit<void(*)(ParseNode*,ByteCodeGenerator*),void(*)(ParseNode*,ByteCodeGenerator*)>
              (pPVar13->pnodeTrue,byteCodeGenerator,p_Var33,postfix,pnode);
    pPVar13 = ParseNode::AsParseNodeIf(pnode);
    if (pPVar13->pnodeFalse == (ParseNodePtr)0x0) goto switchD_0083a0ea_caseD_55;
    pPVar13 = ParseNode::AsParseNodeIf(pnode);
    pPVar16 = (ParseNodeBlock *)pPVar13->pnodeFalse;
    p_Var33 = local_38;
    goto LAB_0083aa97;
  case knopWhile:
  case knopDoWhile:
    ByteCodeGenerator::EnterLoop(byteCodeGenerator);
    pPVar8 = ParseNode::AsParseNodeWhile(pnode);
    p_Var33 = local_38;
    Visit<void(*)(ParseNode*,ByteCodeGenerator*),void(*)(ParseNode*,ByteCodeGenerator*)>
              (pPVar8->pnodeCond,byteCodeGenerator,local_38,postfix,(ParseNode *)0x0);
    pPVar8 = ParseNode::AsParseNodeWhile(pnode);
    Visit<void(*)(ParseNode*,ByteCodeGenerator*),void(*)(ParseNode*,ByteCodeGenerator*)>
              (pPVar8->pnodeBody,byteCodeGenerator,p_Var33,postfix,pnode);
    byteCodeGenerator->loopDepth = byteCodeGenerator->loopDepth - 1;
    goto switchD_0083a0ea_caseD_55;
  case knopForIn:
  case knopForOf:
  case knopForAwaitOf:
    pPVar6 = ParseNode::AsParseNodeForInOrForOf(pnode);
    BeginVisitBlock(pPVar6->pnodeBlock,byteCodeGenerator);
    pPVar6 = ParseNode::AsParseNodeForInOrForOf(pnode);
    p_Var33 = local_38;
    Visit<void(*)(ParseNode*,ByteCodeGenerator*),void(*)(ParseNode*,ByteCodeGenerator*)>
              (pPVar6->pnodeLval,byteCodeGenerator,local_38,postfix,(ParseNode *)0x0);
    pPVar6 = ParseNode::AsParseNodeForInOrForOf(pnode);
    Visit<void(*)(ParseNode*,ByteCodeGenerator*),void(*)(ParseNode*,ByteCodeGenerator*)>
              (pPVar6->pnodeObj,byteCodeGenerator,p_Var33,postfix,(ParseNode *)0x0);
    ByteCodeGenerator::EnterLoop(byteCodeGenerator);
    pPVar6 = ParseNode::AsParseNodeForInOrForOf(pnode);
    Visit<void(*)(ParseNode*,ByteCodeGenerator*),void(*)(ParseNode*,ByteCodeGenerator*)>
              (pPVar6->pnodeBody,byteCodeGenerator,p_Var33,postfix,pnode);
    byteCodeGenerator->loopDepth = byteCodeGenerator->loopDepth - 1;
    pPVar7 = (ParseNodeFnc *)ParseNode::AsParseNodeForInOrForOf(pnode);
LAB_0083a5bd:
    pPVar16 = pPVar7->pnodeScopes;
    goto LAB_0083a8f9;
  case knopBlock:
    pPVar16 = ParseNode::AsParseNodeBlock(pnode);
    if (pPVar16->pnodeStmt == (ParseNodePtr)0x0) {
      pPVar16->pnodeLastValStmt = (ParseNodePtr)0x0;
      goto switchD_0083a0ea_caseD_55;
    }
    BeginVisitBlock(pPVar16,byteCodeGenerator);
    pPVar17 = VisitBlock<void(*)(ParseNode*,ByteCodeGenerator*),void(*)(ParseNode*,ByteCodeGenerator*)>
                        (pPVar16->pnodeStmt,byteCodeGenerator,local_38,postfix,pnode);
    pPVar16->pnodeLastValStmt = pPVar17;
LAB_0083a8f9:
    EndVisitBlock(pPVar16,byteCodeGenerator);
    goto switchD_0083a0ea_caseD_55;
  case knopStrTemplate:
    pPVar10 = ParseNode::AsParseNodeStrTemplate(pnode);
    if ((pPVar10->field_0x2a & 1) == 0) {
      pPVar10 = ParseNode::AsParseNodeStrTemplate(pnode);
      Visit<void(*)(ParseNode*,ByteCodeGenerator*),void(*)(ParseNode*,ByteCodeGenerator*)>
                (pPVar10->pnodeStringLiterals,byteCodeGenerator,local_38,postfix,(ParseNode *)0x0);
    }
    pPVar10 = ParseNode::AsParseNodeStrTemplate(pnode);
    goto LAB_0083aa13;
  case knopWith:
    pPVar18 = ParseNode::AsParseNodeWith(pnode);
    p_Var33 = local_38;
    Visit<void(*)(ParseNode*,ByteCodeGenerator*),void(*)(ParseNode*,ByteCodeGenerator*)>
              (pPVar18->pnodeObj,byteCodeGenerator,local_38,postfix,(ParseNode *)0x0);
    pPVar18 = ParseNode::AsParseNodeWith(pnode);
    VisitWithStmt<void(*)(ParseNode*,ByteCodeGenerator*),void(*)(ParseNode*,ByteCodeGenerator*)>
              (pnode,pPVar18->pnodeObj->location,byteCodeGenerator,p_Var33,postfix,pnode);
    goto switchD_0083a0ea_caseD_55;
  case knopSwitch:
    pPVar29 = ParseNode::AsParseNodeSwitch(pnode);
    p_Var33 = local_38;
    Visit<void(*)(ParseNode*,ByteCodeGenerator*),void(*)(ParseNode*,ByteCodeGenerator*)>
              (pPVar29->pnodeVal,byteCodeGenerator,local_38,postfix,(ParseNode *)0x0);
    pPVar29 = ParseNode::AsParseNodeSwitch(pnode);
    BeginVisitBlock(pPVar29->pnodeBlock,byteCodeGenerator);
    pPVar29 = ParseNode::AsParseNodeSwitch(pnode);
    for (pPVar15 = pPVar29->pnodeCases; pPVar15 != (ParseNodeCase *)0x0;
        pPVar15 = pPVar15->pnodeNext) {
      Visit<void(*)(ParseNode*,ByteCodeGenerator*),void(*)(ParseNode*,ByteCodeGenerator*)>
                ((ParseNode *)pPVar15,byteCodeGenerator,p_Var33,postfix,pnode);
    }
    pPVar29 = ParseNode::AsParseNodeSwitch(pnode);
    Visit<void(*)(ParseNode*,ByteCodeGenerator*),void(*)(ParseNode*,ByteCodeGenerator*)>
              ((ParseNode *)pPVar29->pnodeBlock,byteCodeGenerator,p_Var33,postfix,(ParseNode *)0x0);
    pPVar29 = ParseNode::AsParseNodeSwitch(pnode);
    EndVisitBlock(pPVar29->pnodeBlock,byteCodeGenerator);
    goto switchD_0083a0ea_caseD_55;
  case knopCase:
    pPVar15 = ParseNode::AsParseNodeCase(pnode);
    p_Var33 = local_38;
    Visit<void(*)(ParseNode*,ByteCodeGenerator*),void(*)(ParseNode*,ByteCodeGenerator*)>
              (pPVar15->pnodeExpr,byteCodeGenerator,local_38,postfix,(ParseNode *)0x0);
    pPVar15 = ParseNode::AsParseNodeCase(pnode);
    pPVar16 = pPVar15->pnodeBody;
    goto LAB_0083aa97;
  case knopTryCatch:
    pPVar12 = ParseNode::AsParseNodeTryCatch(pnode);
    p_Var33 = local_38;
    Visit<void(*)(ParseNode*,ByteCodeGenerator*),void(*)(ParseNode*,ByteCodeGenerator*)>
              ((ParseNode *)pPVar12->pnodeTry,byteCodeGenerator,local_38,postfix,pnode);
    pPVar12 = ParseNode::AsParseNodeTryCatch(pnode);
    goto LAB_0083a3d5;
  case knopCatch:
    BeginVisitCatch(pnode,byteCodeGenerator);
    pPVar30 = ParseNode::AsParseNodeCatch(pnode);
    p_Var33 = local_38;
    Visit<void(*)(ParseNode*,ByteCodeGenerator*),void(*)(ParseNode*,ByteCodeGenerator*)>
              (pPVar30->pnodeParam,byteCodeGenerator,local_38,postfix,(ParseNode *)0x0);
    pPVar30 = ParseNode::AsParseNodeCatch(pnode);
    Visit<void(*)(ParseNode*,ByteCodeGenerator*),void(*)(ParseNode*,ByteCodeGenerator*)>
              (pPVar30->pnodeBody,byteCodeGenerator,p_Var33,postfix,pnode);
    EndVisitCatch(pnode,byteCodeGenerator);
    goto switchD_0083a0ea_caseD_55;
  case knopReturn:
    pPVar31 = ParseNode::AsParseNodeReturn(pnode);
    if (pPVar31->pnodeExpr == (ParseNodePtr)0x0) goto switchD_0083a0ea_caseD_55;
    pPVar10 = (ParseNodeStrTemplate *)ParseNode::AsParseNodeReturn(pnode);
LAB_0083aa13:
    pPVar16 = (ParseNodeBlock *)pPVar10->pnodeSubstitutionExpressions;
    p_Var33 = local_38;
    break;
  case knopTry:
    pPVar22 = ParseNode::AsParseNodeTry(pnode);
    goto LAB_0083a5ce;
  case knopThrow:
    goto switchD_0083a0ea_caseD_6d;
  case knopFinally:
    pPVar22 = (ParseNodeTry *)ParseNode::AsParseNodeFinally(pnode);
LAB_0083a5ce:
    pPVar16 = (ParseNodeBlock *)pPVar22->pnodeBody;
    p_Var33 = local_38;
    goto LAB_0083aa97;
  case knopTryFinally:
    pPVar11 = ParseNode::AsParseNodeTryFinally(pnode);
    p_Var33 = local_38;
    Visit<void(*)(ParseNode*,ByteCodeGenerator*),void(*)(ParseNode*,ByteCodeGenerator*)>
              ((ParseNode *)pPVar11->pnodeTry,byteCodeGenerator,local_38,postfix,pnode);
    pPVar12 = (ParseNodeTryCatch *)ParseNode::AsParseNodeTryFinally(pnode);
LAB_0083a3d5:
    pPVar16 = (ParseNodeBlock *)pPVar12->pnodeCatch;
    goto LAB_0083aa97;
  case knopArrayPattern:
    if (byteCodeGenerator->inDestructuredPattern == false) {
      byteCodeGenerator->inDestructuredPattern = true;
      pPVar32 = ParseNode::AsParseNodeUni(pnode);
      Visit<void(*)(ParseNode*,ByteCodeGenerator*),void(*)(ParseNode*,ByteCodeGenerator*)>
                (pPVar32->pnode1,byteCodeGenerator,local_38,postfix,(ParseNode *)0x0);
      byteCodeGenerator->inDestructuredPattern = false;
      goto switchD_0083a0ea_caseD_55;
    }
    goto switchD_0083a0ea_caseD_6d;
  case knopParamPattern:
    pPVar14 = ParseNode::AsParseNodeParamPattern(pnode);
    goto LAB_0083a5ec;
  case knopExportDefault:
    pPVar14 = (ParseNodeParamPattern *)ParseNode::AsParseNodeExportDefault(pnode);
    goto LAB_0083a5ec;
  default:
    if (OVar1 != knopTypeof) {
      if (OVar1 != knopArray) goto switchD_0083a0ea_caseD_30;
      bVar3 = EmitAsConstantArray(pnode,byteCodeGenerator);
      if (bVar3) goto switchD_0083a0ea_caseD_55;
    }
switchD_0083a0ea_caseD_6d:
    pPVar14 = (ParseNodeParamPattern *)ParseNode::AsParseNodeUni(pnode);
LAB_0083a5ec:
    pPVar16 = (ParseNodeBlock *)(pPVar14->super_ParseNodeUni).pnode1;
    p_Var33 = local_38;
  }
  pPVar17 = (ParseNode *)0x0;
LAB_0083aa97:
  Visit<void(*)(ParseNode*,ByteCodeGenerator*),void(*)(ParseNode*,ByteCodeGenerator*)>
            ((ParseNode *)pPVar16,byteCodeGenerator,p_Var33,postfix,pPVar17);
switchD_0083a0ea_caseD_55:
  if (pnodeParent != (ParseNode *)0x0) {
    PropagateFlags(pnode,pnodeParent);
  }
  (*postfix)(pnode,byteCodeGenerator);
  return;
}

Assistant:

void Visit(ParseNode *pnode, ByteCodeGenerator* byteCodeGenerator, PrefixFn prefix, PostfixFn postfix, ParseNode *pnodeParent)
{
    if (pnode == nullptr)
    {
        return;
    }

    ThreadContext::ProbeCurrentStackNoDispose(Js::Constants::MinStackByteCodeVisitor, byteCodeGenerator->GetScriptContext());

    prefix(pnode, byteCodeGenerator);
    switch (pnode->nop)
    {
    default:
    {
        uint flags = ParseNode::Grfnop(pnode->nop);
        if (flags&fnopUni)
        {
            Visit(pnode->AsParseNodeUni()->pnode1, byteCodeGenerator, prefix, postfix);
        }
        else if (flags&fnopBin)
        {
            Visit(pnode->AsParseNodeBin()->pnode1, byteCodeGenerator, prefix, postfix);
            Visit(pnode->AsParseNodeBin()->pnode2, byteCodeGenerator, prefix, postfix);

            if (ByteCodeGenerator::IsSuper(pnode->AsParseNodeBin()->pnode1))
            {
                Visit(pnode->AsParseNodeSuperReference()->pnodeThis, byteCodeGenerator, prefix, postfix);
            }
        }

        break;
    }

    case knopParamPattern:
        Visit(pnode->AsParseNodeParamPattern()->pnode1, byteCodeGenerator, prefix, postfix);
        break;

    case knopArrayPattern:
        if (!byteCodeGenerator->InDestructuredPattern())
        {
            byteCodeGenerator->SetInDestructuredPattern(true);
            Visit(pnode->AsParseNodeUni()->pnode1, byteCodeGenerator, prefix, postfix);
            byteCodeGenerator->SetInDestructuredPattern(false);
        }
        else
        {
            Visit(pnode->AsParseNodeUni()->pnode1, byteCodeGenerator, prefix, postfix);
        }
        break;

    case knopCall:
        Visit(pnode->AsParseNodeCall()->pnodeTarget, byteCodeGenerator, prefix, postfix);
        Visit(pnode->AsParseNodeCall()->pnodeArgs, byteCodeGenerator, prefix, postfix);

        if (pnode->AsParseNodeCall()->isSuperCall)
        {
            Visit(pnode->AsParseNodeSuperCall()->pnodeThis, byteCodeGenerator, prefix, postfix);
            Visit(pnode->AsParseNodeSuperCall()->pnodeNewTarget, byteCodeGenerator, prefix, postfix);
        }
        break;

    case knopNew:
    {
        Visit(pnode->AsParseNodeCall()->pnodeTarget, byteCodeGenerator, prefix, postfix);
        if (!IsCallOfConstants(pnode))
        {
            Visit(pnode->AsParseNodeCall()->pnodeArgs, byteCodeGenerator, prefix, postfix);
        }
        break;
    }

    case knopQmark:
        Visit(pnode->AsParseNodeTri()->pnode1, byteCodeGenerator, prefix, postfix);
        Visit(pnode->AsParseNodeTri()->pnode2, byteCodeGenerator, prefix, postfix);
        Visit(pnode->AsParseNodeTri()->pnode3, byteCodeGenerator, prefix, postfix);
        break;
    case knopList:
        VisitList(pnode, byteCodeGenerator, prefix, postfix);
        break;
    // PTNODE(knopVarDecl    , "varDcl"    ,None    ,Var  ,fnopNone)
    case knopVarDecl:
    case knopConstDecl:
    case knopLetDecl:
        if (pnode->AsParseNodeVar()->pnodeInit != nullptr)
            Visit(pnode->AsParseNodeVar()->pnodeInit, byteCodeGenerator, prefix, postfix);
        break;
    // PTNODE(knopFncDecl    , "fncDcl"    ,None    ,Fnc  ,fnopLeaf)
    case knopFncDecl:
    {
        // Inner function declarations are visited before anything else in the scope.
        // (See VisitFunctionsInScope.)
        break;
    }
    case knopClassDecl:
    {
        Visit(pnode->AsParseNodeClass()->pnodeDeclName, byteCodeGenerator, prefix, postfix);
        // Now visit the class name and methods.
        BeginVisitBlock(pnode->AsParseNodeClass()->pnodeBlock, byteCodeGenerator);
        // The extends clause is bound to the scope which contains the class name
        // (and the class name identifier is in a TDZ when the extends clause is evaluated).
        // See ES 2017 14.5.13 Runtime Semantics: ClassDefinitionEvaluation.
        Visit(pnode->AsParseNodeClass()->pnodeExtends, byteCodeGenerator, prefix, postfix);
        Visit(pnode->AsParseNodeClass()->pnodeName, byteCodeGenerator, prefix, postfix);
        Visit(pnode->AsParseNodeClass()->pnodeConstructor, byteCodeGenerator, prefix, postfix);
        Visit(pnode->AsParseNodeClass()->pnodeMembers, byteCodeGenerator, prefix, postfix);
        EndVisitBlock(pnode->AsParseNodeClass()->pnodeBlock, byteCodeGenerator);
        break;
    }
    case knopStrTemplate:
    {
        // Visit the string node lists only if we do not have a tagged template.
        // We never need to visit the raw strings as they are not used in non-tagged templates and
        // tagged templates will register them as part of the callsite constant object.
        if (!pnode->AsParseNodeStrTemplate()->isTaggedTemplate)
        {
            Visit(pnode->AsParseNodeStrTemplate()->pnodeStringLiterals, byteCodeGenerator, prefix, postfix);
        }
        Visit(pnode->AsParseNodeStrTemplate()->pnodeSubstitutionExpressions, byteCodeGenerator, prefix, postfix);
        break;
    }
    case knopExportDefault:
        Visit(pnode->AsParseNodeExportDefault()->pnodeExpr, byteCodeGenerator, prefix, postfix);
        break;
    // PTNODE(knopProg       , "program"    ,None    ,Fnc  ,fnopNone)
    case knopProg:
    {
        // We expect that the global statements have been generated (meaning that the pnodeFncs
        // field is a real pointer, not an enumeration).
        Assert(pnode->AsParseNodeFnc()->pnodeBody);

        uint i = 0;
        VisitNestedScopes(pnode->AsParseNodeFnc()->pnodeScopes, pnode, byteCodeGenerator, prefix, postfix, &i);
        // Visiting global code: track the last value statement.
        BeginVisitBlock(pnode->AsParseNodeFnc()->pnodeScopes, byteCodeGenerator);
        pnode->AsParseNodeProg()->pnodeLastValStmt = VisitBlock(pnode->AsParseNodeFnc()->pnodeBody, byteCodeGenerator, prefix, postfix);
        EndVisitBlock(pnode->AsParseNodeFnc()->pnodeScopes, byteCodeGenerator);

        break;
    }
    case knopFor:
        BeginVisitBlock(pnode->AsParseNodeFor()->pnodeBlock, byteCodeGenerator);
        Visit(pnode->AsParseNodeFor()->pnodeInit, byteCodeGenerator, prefix, postfix);
        byteCodeGenerator->EnterLoop();
        Visit(pnode->AsParseNodeFor()->pnodeCond, byteCodeGenerator, prefix, postfix);
        Visit(pnode->AsParseNodeFor()->pnodeIncr, byteCodeGenerator, prefix, postfix);
        Visit(pnode->AsParseNodeFor()->pnodeBody, byteCodeGenerator, prefix, postfix, pnode);
        byteCodeGenerator->ExitLoop();
        EndVisitBlock(pnode->AsParseNodeFor()->pnodeBlock, byteCodeGenerator);
        break;
    // PTNODE(knopIf         , "if"        ,None    ,If   ,fnopNone)
    case knopIf:
        Visit(pnode->AsParseNodeIf()->pnodeCond, byteCodeGenerator, prefix, postfix);
        Visit(pnode->AsParseNodeIf()->pnodeTrue, byteCodeGenerator, prefix, postfix, pnode);
        if (pnode->AsParseNodeIf()->pnodeFalse != nullptr)
        {
            Visit(pnode->AsParseNodeIf()->pnodeFalse, byteCodeGenerator, prefix, postfix, pnode);
        }
        break;
    // PTNODE(knopWhile      , "while"        ,None    ,While,fnopBreak|fnopContinue)
    // PTNODE(knopDoWhile    , "do-while"    ,None    ,While,fnopBreak|fnopContinue)
    case knopDoWhile:
    case knopWhile:
        byteCodeGenerator->EnterLoop();
        Visit(pnode->AsParseNodeWhile()->pnodeCond, byteCodeGenerator, prefix, postfix);
        Visit(pnode->AsParseNodeWhile()->pnodeBody, byteCodeGenerator, prefix, postfix, pnode);
        byteCodeGenerator->ExitLoop();
        break;
    // PTNODE(knopForIn      , "for in"    ,None    ,ForIn,fnopBreak|fnopContinue|fnopCleanup)
    case knopForIn:
    case knopForOf:
    case knopForAwaitOf:
        BeginVisitBlock(pnode->AsParseNodeForInOrForOf()->pnodeBlock, byteCodeGenerator);
        Visit(pnode->AsParseNodeForInOrForOf()->pnodeLval, byteCodeGenerator, prefix, postfix);
        Visit(pnode->AsParseNodeForInOrForOf()->pnodeObj, byteCodeGenerator, prefix, postfix);
        byteCodeGenerator->EnterLoop();
        Visit(pnode->AsParseNodeForInOrForOf()->pnodeBody, byteCodeGenerator, prefix, postfix, pnode);
        byteCodeGenerator->ExitLoop();
        EndVisitBlock(pnode->AsParseNodeForInOrForOf()->pnodeBlock, byteCodeGenerator);
        break;
    // PTNODE(knopReturn     , "return"    ,None    ,Uni  ,fnopNone)
    case knopReturn:
        if (pnode->AsParseNodeReturn()->pnodeExpr != nullptr)
            Visit(pnode->AsParseNodeReturn()->pnodeExpr, byteCodeGenerator, prefix, postfix);
        break;
    // PTNODE(knopBlock      , "{}"        ,None    ,Block,fnopNone)
    case knopBlock:
    {
        ParseNodeBlock * pnodeBlock = pnode->AsParseNodeBlock();
        if (pnodeBlock->pnodeStmt != nullptr)
        {
            BeginVisitBlock(pnodeBlock, byteCodeGenerator);
            pnodeBlock->pnodeLastValStmt = VisitBlock(pnodeBlock->pnodeStmt, byteCodeGenerator, prefix, postfix, pnode);
            EndVisitBlock(pnodeBlock, byteCodeGenerator);
        }
        else
        {
            pnodeBlock->pnodeLastValStmt = nullptr;
        }
        break;
    }
    // PTNODE(knopWith       , "with"        ,None    ,With ,fnopCleanup)
    case knopWith:
        Visit(pnode->AsParseNodeWith()->pnodeObj, byteCodeGenerator, prefix, postfix);
        VisitWithStmt(pnode, pnode->AsParseNodeWith()->pnodeObj->location, byteCodeGenerator, prefix, postfix, pnode);
        break;
    // PTNODE(knopBreak      , "break"        ,None    ,Jump ,fnopNone)
    case knopBreak:
        // TODO: some representation of target
        break;
    // PTNODE(knopContinue   , "continue"    ,None    ,Jump ,fnopNone)
    case knopContinue:
        // TODO: some representation of target
        break;
    // PTNODE(knopSwitch     , "switch"    ,None    ,Switch,fnopBreak)
    case knopSwitch:
        Visit(pnode->AsParseNodeSwitch()->pnodeVal, byteCodeGenerator, prefix, postfix);
        BeginVisitBlock(pnode->AsParseNodeSwitch()->pnodeBlock, byteCodeGenerator);
        for (ParseNodeCase *pnodeT = pnode->AsParseNodeSwitch()->pnodeCases; nullptr != pnodeT; pnodeT = pnodeT->pnodeNext)
        {
            Visit(pnodeT, byteCodeGenerator, prefix, postfix, pnode);
        }
        Visit(pnode->AsParseNodeSwitch()->pnodeBlock, byteCodeGenerator, prefix, postfix);
        EndVisitBlock(pnode->AsParseNodeSwitch()->pnodeBlock, byteCodeGenerator);
        break;
    // PTNODE(knopCase       , "case"        ,None    ,Case ,fnopNone)
    case knopCase:
        Visit(pnode->AsParseNodeCase()->pnodeExpr, byteCodeGenerator, prefix, postfix);
        Visit(pnode->AsParseNodeCase()->pnodeBody, byteCodeGenerator, prefix, postfix, pnode);
        break;
    case knopTypeof:
        Visit(pnode->AsParseNodeUni()->pnode1, byteCodeGenerator, prefix, postfix);
        break;
    // PTNODE(knopTryCatchFinally,"try-catch-finally",None,TryCatchFinally,fnopCleanup)
    case knopTryFinally:
        Visit(pnode->AsParseNodeTryFinally()->pnodeTry, byteCodeGenerator, prefix, postfix, pnode);
        Visit(pnode->AsParseNodeTryFinally()->pnodeFinally, byteCodeGenerator, prefix, postfix, pnode);
        break;
    // PTNODE(knopTryCatch      , "try-catch" ,None    ,TryCatch  ,fnopCleanup)
    case knopTryCatch:
        Visit(pnode->AsParseNodeTryCatch()->pnodeTry, byteCodeGenerator, prefix, postfix, pnode);
        Visit(pnode->AsParseNodeTryCatch()->pnodeCatch, byteCodeGenerator, prefix, postfix, pnode);
        break;
    // PTNODE(knopTry        , "try"       ,None    ,Try  ,fnopCleanup)
    case knopTry:
        Visit(pnode->AsParseNodeTry()->pnodeBody, byteCodeGenerator, prefix, postfix, pnode);
        break;
    case knopCatch:
        BeginVisitCatch(pnode, byteCodeGenerator);
        Visit(pnode->AsParseNodeCatch()->GetParam(), byteCodeGenerator, prefix, postfix);
        Visit(pnode->AsParseNodeCatch()->pnodeBody, byteCodeGenerator, prefix, postfix, pnode);
        EndVisitCatch(pnode, byteCodeGenerator);
        break;
    case knopFinally:
        Visit(pnode->AsParseNodeFinally()->pnodeBody, byteCodeGenerator, prefix, postfix, pnode);
        break;
    // PTNODE(knopThrow      , "throw"     ,None    ,Uni  ,fnopNone)
    case knopThrow:
        Visit(pnode->AsParseNodeUni()->pnode1, byteCodeGenerator, prefix, postfix);
        break;
    case knopArray:
    {
        bool arrayLitOpt = EmitAsConstantArray(pnode, byteCodeGenerator);
        if (!arrayLitOpt)
        {
            Visit(pnode->AsParseNodeUni()->pnode1, byteCodeGenerator, prefix, postfix);
        }
        break;
    }
    case knopComma:
    {
        ParseNode *pnode1 = pnode->AsParseNodeBin()->pnode1;
        if (pnode1->nop == knopComma)
        {
            // Spot-fix to avoid recursion on very large comma expressions.
            ArenaAllocator *alloc = byteCodeGenerator->GetAllocator();
            SList<ParseNode*> rhsStack(alloc);
            do
            {
                rhsStack.Push(pnode1->AsParseNodeBin()->pnode2);
                pnode1 = pnode1->AsParseNodeBin()->pnode1;
            }
            while (pnode1->nop == knopComma);

            Visit(pnode1, byteCodeGenerator, prefix, postfix);
            while (!rhsStack.Empty())
            {
                ParseNode *pnodeRhs = rhsStack.Pop();
                Visit(pnodeRhs, byteCodeGenerator, prefix, postfix);
            }
        }
        else
        {
            Visit(pnode1, byteCodeGenerator, prefix, postfix);
        }
        Visit(pnode->AsParseNodeBin()->pnode2, byteCodeGenerator, prefix, postfix);
    }
        break;
    }
    if (pnodeParent)
    {
        PropagateFlags(pnode, pnodeParent);
    }
    postfix(pnode, byteCodeGenerator);
}